

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_enable_texture(uint id)

{
  rf_vertex_buffer *prVar1;
  long lVar2;
  rf_render_batch *prVar3;
  _Bool _Var4;
  int local_14;
  int local_10;
  uint id_local;
  
  if (((rf__ctx->field_0).current_batch)->draw_calls
      [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].texture_id != id) {
    if (0 < ((rf__ctx->field_0).current_batch)->draw_calls
            [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_count) {
      if (((rf__ctx->field_0).current_batch)->draw_calls
          [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].mode == RF_LINES) {
        if (((rf__ctx->field_0).current_batch)->draw_calls
            [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_count < 4) {
          local_10 = ((rf__ctx->field_0).current_batch)->draw_calls
                     [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_count;
        }
        else {
          local_10 = ((rf__ctx->field_0).current_batch)->draw_calls
                     [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_count % 4;
        }
        ((rf__ctx->field_0).current_batch)->draw_calls
        [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_alignment = local_10;
      }
      else if (((rf__ctx->field_0).current_batch)->draw_calls
               [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].mode == RF_TRIANGLES) {
        if (((rf__ctx->field_0).current_batch)->draw_calls
            [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_count < 4) {
          local_14 = 1;
        }
        else {
          local_14 = 4 - ((rf__ctx->field_0).current_batch)->draw_calls
                         [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_count
                         % 4;
        }
        ((rf__ctx->field_0).current_batch)->draw_calls
        [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_alignment = local_14;
      }
      else {
        ((rf__ctx->field_0).current_batch)->draw_calls
        [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_alignment = 0;
      }
      _Var4 = rf_gfx_check_buffer_limit
                        (((rf__ctx->field_0).current_batch)->draw_calls
                         [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].
                         vertex_alignment);
      if (_Var4) {
        rf_gfx_draw();
      }
      else {
        prVar1 = ((rf__ctx->field_0).current_batch)->vertex_buffers;
        lVar2 = ((rf__ctx->field_0).current_batch)->current_buffer;
        prVar1[lVar2].v_counter =
             ((rf__ctx->field_0).current_batch)->draw_calls
             [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_alignment +
             prVar1[lVar2].v_counter;
        prVar1 = ((rf__ctx->field_0).current_batch)->vertex_buffers;
        lVar2 = ((rf__ctx->field_0).current_batch)->current_buffer;
        prVar1[lVar2].c_counter =
             ((rf__ctx->field_0).current_batch)->draw_calls
             [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_alignment +
             prVar1[lVar2].c_counter;
        prVar1 = ((rf__ctx->field_0).current_batch)->vertex_buffers;
        lVar2 = ((rf__ctx->field_0).current_batch)->current_buffer;
        prVar1[lVar2].tc_counter =
             ((rf__ctx->field_0).current_batch)->draw_calls
             [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_alignment +
             prVar1[lVar2].tc_counter;
        prVar3 = (rf__ctx->field_0).current_batch;
        prVar3->draw_calls_counter = prVar3->draw_calls_counter + 1;
      }
    }
    if (0xff < ((rf__ctx->field_0).current_batch)->draw_calls_counter) {
      rf_gfx_draw();
    }
    ((rf__ctx->field_0).current_batch)->draw_calls
    [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].texture_id = id;
    ((rf__ctx->field_0).current_batch)->draw_calls
    [((rf__ctx->field_0).current_batch)->draw_calls_counter + -1].vertex_count = 0;
  }
  return;
}

Assistant:

RF_API void rf_gfx_enable_texture(unsigned int id)
{
    if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].texture_id != id)
    {
        if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count > 0)
        {
            // Make sure current rf_ctx->gl_ctx.draws[i].vertex_count is aligned a multiple of 4,
            // that way, following QUADS drawing will keep aligned with index processing
            // It implies adding some extra alignment vertex at the end of the draw,
            // those vertex are not processed but they are considered as an additional offset
            // for the next set of vertex to be drawn
            if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].mode == RF_LINES)
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = ((rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count < 4) ? rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count : rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count % 4);
            }
            else if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].mode == RF_TRIANGLES)
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = ((rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count < 4) ? 1 : (4 - (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count % 4)));
            }
            else
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = 0;
            }

            if (rf_gfx_check_buffer_limit(rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment))
            {
                rf_gfx_draw();
            }
            else
            {
                rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;
                rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;
                rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;

                rf_batch.draw_calls_counter++;
            }
        }

        if (rf_batch.draw_calls_counter >= RF_DEFAULT_BATCH_DRAW_CALLS_COUNT)
        {
            rf_gfx_draw();
        }

        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].texture_id = id;
        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count = 0;
    }
}